

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O1

Event * __thiscall EventQueue::WaitEvent(EventQueue *this,uint32_t mstimeout)

{
  Node *pNVar1;
  bool bVar2;
  Event *pEVar3;
  AutoLock _auto_lock_;
  AutoLock AStack_48;
  
  AutoLock::AutoLock(&AStack_48,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x58);
  pNVar1 = ((this->mQueue).mHead)->next;
  if (pNVar1 == (this->mQueue).mTail) {
    pEVar3 = (Event *)0x0;
  }
  else {
    pEVar3 = pNVar1->val;
    JetHead::list<Event_*>::pop_front(&this->mQueue);
  }
  if (pEVar3 == (Event *)0x0) {
    do {
      bVar2 = Condition::Wait(&this->mWait,&this->mLock,mstimeout);
      if (bVar2) {
        pNVar1 = ((this->mQueue).mHead)->next;
        if (pNVar1 == (this->mQueue).mTail) {
          pEVar3 = (Event *)0x0;
        }
        else {
          pEVar3 = pNVar1->val;
          JetHead::list<Event_*>::pop_front(&this->mQueue);
        }
        if (pEVar3 == (Event *)0x0) {
          jh_log_print(0,"Event *EventQueue::WaitEvent(uint32_t)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                       ,100,"Signalled empty queue");
          pEVar3 = (Event *)0x0;
        }
      }
      else {
        pEVar3 = (Event *)0x0;
        if (mstimeout != 0) break;
      }
    } while (pEVar3 == (Event *)0x0);
  }
  AutoLock::~AutoLock(&AStack_48);
  return pEVar3;
}

Assistant:

Event *EventQueue::WaitEvent( uint32_t mstimeout )
{
	TRACE_BEGIN( LOG_LVL_NOISE );

	DebugAutoLock( mLock );
	Event *ev = pollEventInternal();

	while ( ev == NULL )
	{
		LOG( "timeout %d", mstimeout );
		if ( mWait.Wait( mLock, mstimeout ) )
		{
			LOG( "signalled" );
			ev = pollEventInternal();
			if ( ev == NULL )
			{
				LOG_ERR( "Signalled empty queue" );
			}
		}
		else if ( mstimeout > 0 )
			return NULL;
		
		LOG( "done" );
	}	
	
	return ev;
}